

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O0

void __thiscall
Buffer_make_contiguous_fires_no_change_events_Test::TestBody
          (Buffer_make_contiguous_fires_no_change_events_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_158;
  Message local_150;
  size_type local_148;
  int local_13c;
  undefined1 local_138 [8];
  AssertionResult gtest_ar;
  AssertHelper local_108;
  Message local_100;
  void *local_f8;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_;
  undefined1 local_d0 [8];
  BufferWithReadonlyStrings local;
  Buffer_make_contiguous_fires_no_change_events_Test *this_local;
  
  local.changes.super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::BufferWithReadonlyStrings
            ((BufferWithReadonlyStrings *)local_d0);
  anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::start_listening_to_changes
            ((BufferWithReadonlyStrings *)local_d0);
  local_f8 = bfy_buffer_make_all_contiguous((bfy_buffer *)local_d0);
  testing::AssertionResult::AssertionResult<void*>
            ((AssertionResult *)local_f0,&local_f8,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_f0,
               (AssertionResult *)"bfy_buffer_make_all_contiguous(&local.buf)","false","true",in_R9)
    ;
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar.message_);
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x52f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_108,&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  local_13c = 0;
  local_148 = std::size<std::vector<bfy_changed_cb_info,std::allocator<bfy_changed_cb_info>>>
                        ((vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_> *)
                         ((long)&local.allstrs.field_2 + 8));
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_138,"0","std::size(local.changes)",&local_13c,&local_148);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x530,pcVar2);
    testing::internal::AssertHelper::operator=(&local_158,&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::~BufferWithReadonlyStrings
            ((BufferWithReadonlyStrings *)local_d0);
  return;
}

Assistant:

TEST(Buffer, make_contiguous_fires_no_change_events) {
    BufferWithReadonlyStrings local;

    local.start_listening_to_changes();
    EXPECT_TRUE(bfy_buffer_make_all_contiguous(&local.buf));
    EXPECT_EQ(0, std::size(local.changes));
}